

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O2

void in2_r1_32u(DisasContext_conflict13 *s,DisasOps *o)

{
  TCGContext_conflict12 *tcg_ctx;
  int iVar1;
  TCGv_i64 ret;
  
  tcg_ctx = s->uc->tcg_ctx;
  ret = tcg_temp_new_i64(tcg_ctx);
  o->in2 = ret;
  iVar1 = get_field1(s,FLD_O_r1,FLD_C_b1);
  tcg_gen_ext32u_i64_s390x(tcg_ctx,ret,tcg_ctx->regs[iVar1]);
  return;
}

Assistant:

static void in2_r1_32u(DisasContext *s, DisasOps *o)
{
    TCGContext *tcg_ctx = s->uc->tcg_ctx;
    o->in2 = tcg_temp_new_i64(tcg_ctx);
    tcg_gen_ext32u_i64(tcg_ctx, o->in2, tcg_ctx->regs[get_field(s, r1)]);
}